

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void disas_unlk(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  TCGContext_conflict2 *tcg_ctx;
  TCGv_i32 arg;
  TCGv_i32 ret;
  TCGv_i32 *ppTVar1;
  TCGv_i32 arg_00;
  uintptr_t o_1;
  uintptr_t o;
  
  tcg_ctx = s->uc->tcg_ctx;
  ret = tcg_temp_new_i32(tcg_ctx);
  if (((uint)s->writeback_mask >> (insn & 7) & 1) == 0) {
    ppTVar1 = s->uc->tcg_ctx->cpu_aregs;
  }
  else {
    ppTVar1 = s->writeback;
  }
  arg = ppTVar1[insn & 7];
  tcg_gen_mov_i32(tcg_ctx,ret,arg);
  arg_00 = gen_load(s,2,ret,0,(uint)((((s->base).tb)->flags >> 0xd & 1) == 0));
  tcg_gen_mov_i32(tcg_ctx,arg,arg_00);
  if ((s->writeback_mask & 0x80) == 0) {
    ppTVar1 = s->uc->tcg_ctx->cpu_aregs;
  }
  else {
    ppTVar1 = s->writeback;
  }
  tcg_gen_addi_i32_m68k(tcg_ctx,ppTVar1[7],ret,4);
  tcg_temp_free_internal_m68k(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
  tcg_temp_free_internal_m68k(tcg_ctx,(TCGTemp *)(arg_00 + (long)tcg_ctx));
  return;
}

Assistant:

DISAS_INSN(unlk)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv src;
    TCGv reg;
    TCGv tmp;

    src = tcg_temp_new(tcg_ctx);
    reg = AREG(insn, 0);
    tcg_gen_mov_i32(tcg_ctx, src, reg);
    tmp = gen_load(s, OS_LONG, src, 0, IS_USER(s));
    tcg_gen_mov_i32(tcg_ctx, reg, tmp);
    tcg_gen_addi_i32(tcg_ctx, QREG_SP, src, 4);
    tcg_temp_free(tcg_ctx, src);
    tcg_temp_free(tcg_ctx, tmp);
}